

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O1

bool __thiscall basisu::basisu_frontend::init_global_codebooks(basisu_frontend *this)

{
  vector<basisu::vector<unsigned_int>_> *this_00;
  undefined8 *puVar1;
  uint8_t uVar2;
  byte bVar3;
  endpoint_cluster_etc_params *peVar4;
  void *pvVar5;
  endpoint *peVar6;
  job_pool *this_01;
  void *__ptr;
  uint *puVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  char *pcVar14;
  char cVar15;
  uint uVar16;
  byte bVar17;
  uint32_t new_size_1;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  uint32_t new_size_5;
  uint32_t uVar21;
  vector<unsigned_int> *pvVar22;
  etc_block *peVar23;
  long lVar24;
  basisu_lowlevel_etc1s_transcoder *pbVar25;
  uint32_t new_size;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  elemental_vector *local_68;
  cluster_subblock_etc_params_vec *local_60;
  uint32_t local_54;
  basisu_lowlevel_etc1s_transcoder *local_50;
  basisu_frontend *local_48;
  elemental_vector *local_40;
  elemental_vector *local_38;
  
  local_50 = (this->m_params).m_pGlobal_codebooks;
  local_60 = &this->m_endpoint_cluster_etc_params;
  uVar19 = (local_50->m_local_endpoints).m_size;
  uVar16 = (this->m_endpoint_cluster_etc_params).m_size;
  uVar12 = uVar16 - uVar19;
  if (uVar12 != 0) {
    if (uVar16 < uVar19 || uVar12 == 0) {
      if ((this->m_endpoint_cluster_etc_params).m_capacity < uVar19) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_60,uVar19,uVar16 + 1 == uVar19,0x38,
                   vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::object_mover,false)
        ;
      }
      uVar16 = (this->m_endpoint_cluster_etc_params).m_size;
      if (uVar19 - uVar16 != 0) {
        peVar4 = (this->m_endpoint_cluster_etc_params).m_p;
        lVar24 = 0;
        do {
          puVar1 = (undefined8 *)((long)peVar4[uVar16].m_color_error + lVar24 + 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)peVar4[uVar16].m_color_error + lVar24);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)&peVar4[uVar16].m_color_unscaled[0].field_0 + lVar24);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)(peVar4[uVar16].m_color_used + lVar24 + -1) = 0;
          lVar24 = lVar24 + 0x38;
        } while ((ulong)(uVar19 - uVar16) * 0x38 - lVar24 != 0);
      }
    }
    else {
      peVar4 = local_60->m_p;
      lVar24 = 0;
      do {
        pvVar5 = *(void **)((long)peVar4[uVar19].m_color_error + lVar24 + 0x10);
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
        }
        lVar24 = lVar24 + 0x38;
      } while ((ulong)uVar12 * 0x38 - lVar24 != 0);
    }
    (this->m_endpoint_cluster_etc_params).m_size = uVar19;
  }
  pbVar25 = local_50;
  if ((local_50->m_local_endpoints).m_size != 0) {
    lVar24 = 0;
    uVar13 = 0;
    do {
      if ((this->m_endpoint_cluster_etc_params).m_size <= uVar13) goto LAB_0023046e;
      *(uint *)((long)local_60->m_p->m_inten_table + lVar24) =
           (uint)(local_50->m_local_endpoints).m_p[uVar13].m_inten5;
      if ((local_50->m_local_endpoints).m_size <= uVar13) {
LAB_0023050e:
        pcVar14 = 
        "const T &basisu::vector<basist::endpoint>::operator[](size_t) const [T = basist::endpoint]"
        ;
LAB_00230445:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x177,pcVar14);
      }
      if (((this->m_endpoint_cluster_etc_params).m_size <= uVar13) ||
         (*(uint *)((long)((this->m_endpoint_cluster_etc_params).m_p)->m_inten_table + lVar24 + 4) =
               (uint)(local_50->m_local_endpoints).m_p[uVar13].m_inten5,
         (this->m_endpoint_cluster_etc_params).m_size <= uVar13)) goto LAB_0023046e;
      if ((local_50->m_local_endpoints).m_size <= uVar13) goto LAB_0023050e;
      peVar4 = (this->m_endpoint_cluster_etc_params).m_p;
      peVar6 = (local_50->m_local_endpoints).m_p;
      uVar2 = peVar6[uVar13].m_color5.field_0.field_0.b;
      *(undefined2 *)((long)&peVar4->m_color_unscaled[0].field_0 + lVar24) =
           *(undefined2 *)&peVar6[uVar13].m_color5.field_0;
      peVar4->m_color_unscaled[0].field_0.m_comps[lVar24 + 2] = uVar2;
      peVar4->m_color_unscaled[0].field_0.m_comps[lVar24 + 3] = 0xff;
      if (((this->m_endpoint_cluster_etc_params).m_size <= uVar13) ||
         (((this->m_endpoint_cluster_etc_params).m_p)->m_color_used[lVar24] = true,
         (this->m_endpoint_cluster_etc_params).m_size <= uVar13)) goto LAB_0023046e;
      local_60->m_p->m_color_used[lVar24 + 2] = true;
      uVar13 = uVar13 + 1;
      lVar24 = lVar24 + 0x38;
    } while (uVar13 < (local_50->m_local_endpoints).m_size);
  }
  uVar19 = (local_50->m_local_selectors).m_size;
  uVar16 = (this->m_optimized_cluster_selectors).m_size;
  if (uVar16 != uVar19) {
    if ((uVar16 <= uVar19) && ((this->m_optimized_cluster_selectors).m_capacity < uVar19)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_optimized_cluster_selectors,uVar19,
                 uVar16 + 1 == uVar19,8,(object_mover)0x0,false);
    }
    (this->m_optimized_cluster_selectors).m_size = uVar19;
  }
  local_48 = this;
  if ((this->m_optimized_cluster_selectors).m_size != 0) {
    uVar13 = 0;
    do {
      lVar24 = 0;
      do {
        bVar18 = 0;
        bVar11 = 0;
        uVar20 = 0;
        do {
          if ((this->m_optimized_cluster_selectors).m_size <= uVar13) goto LAB_00230411;
          if ((pbVar25->m_local_selectors).m_size <= uVar13) {
            pcVar14 = 
            "const T &basisu::vector<basist::selector>::operator[](size_t) const [T = basist::selector]"
            ;
            goto LAB_00230445;
          }
          if (3 < ((uint)uVar20 | (uint)lVar24)) {
            __assert_fail("(x < 4) && (y < 4)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_transcoder_internal.h"
                          ,0x2f6,"uint32_t basist::selector::get_selector(uint32_t, uint32_t) const"
                         );
          }
          peVar23 = (this->m_optimized_cluster_selectors).m_p;
          lVar10 = uVar13 * 8 - (uVar20 >> 1);
          bVar8 = bVar18 & 4;
          bVar9 = (byte)lVar24;
          bVar3 = (&g_selector_index_to_etc1)
                  [(pbVar25->m_local_selectors).m_p[uVar13].m_selectors[lVar24] >> (bVar11 & 0x1f) &
                   3];
          bVar17 = ~(byte)(1 << (bVar8 | bVar9 & 0x1f));
          *(byte *)((long)peVar23 + lVar10 + 7) =
               (byte)((bVar3 & 1) << (bVar8 | bVar9 & 0x1f)) |
               *(byte *)((long)peVar23 + lVar10 + 7) & bVar17;
          *(byte *)((long)peVar23 + lVar10 + 5) =
               (bVar3 >> 1) << (bVar8 | bVar9 & 0x1f) |
               bVar17 & *(byte *)((long)peVar23 + lVar10 + 5);
          uVar19 = (uint)uVar20 + 1;
          uVar20 = (ulong)uVar19;
          bVar11 = bVar11 + 2;
          bVar18 = bVar18 + 4;
          pbVar25 = local_50;
        } while (uVar19 != 4);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 4);
      uVar13 = uVar13 + 1;
    } while (uVar13 < (this->m_optimized_cluster_selectors).m_size);
  }
  uVar19 = this->m_total_blocks;
  uVar16 = (this->m_block_endpoint_clusters_indices).m_size;
  if (uVar16 != uVar19) {
    if ((uVar16 <= uVar19) && ((this->m_block_endpoint_clusters_indices).m_capacity < uVar19)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_block_endpoint_clusters_indices,uVar19,
                 uVar16 + 1 == uVar19,8,(object_mover)0x0,false);
    }
    (this->m_block_endpoint_clusters_indices).m_size = uVar19;
  }
  uVar19 = this->m_total_blocks;
  uVar16 = (this->m_orig_encoded_blocks).m_size;
  if (uVar16 != uVar19) {
    if ((uVar16 <= uVar19) && ((this->m_orig_encoded_blocks).m_capacity < uVar19)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_orig_encoded_blocks,uVar19,uVar16 + 1 == uVar19,8,
                 (object_mover)0x0,false);
    }
    (this->m_orig_encoded_blocks).m_size = uVar19;
  }
  local_40 = (elemental_vector *)&this->m_block_selector_cluster_index;
  uVar19 = this->m_total_blocks;
  uVar16 = (this->m_block_selector_cluster_index).m_size;
  if (uVar16 != uVar19) {
    if (uVar16 <= uVar19) {
      if ((this->m_block_selector_cluster_index).m_capacity < uVar19) {
        elemental_vector::increase_capacity
                  (local_40,uVar19,uVar16 + 1 == uVar19,4,(object_mover)0x0,false);
      }
      uVar16 = (this->m_block_selector_cluster_index).m_size;
      memset((this->m_block_selector_cluster_index).m_p + uVar16,0,(ulong)(uVar19 - uVar16) << 2);
    }
    (this->m_block_selector_cluster_index).m_size = uVar19;
  }
  local_68 = (elemental_vector *)&this->m_endpoint_clusters;
  local_38 = (elemental_vector *)&this->m_encoded_blocks;
  uVar21 = 0;
  do {
    local_54 = uVar21;
    debug_printf("init_global_codebooks: pass %u\n");
    uVar19 = this->m_total_blocks;
    if (uVar19 != 0) {
      uVar16 = 0;
      do {
        uVar12 = uVar16 + 0x80;
        if (uVar12 <= uVar19) {
          uVar19 = uVar12;
        }
        this_01 = (this->m_params).m_pJob_pool;
        local_78 = (code *)0x0;
        pcStack_70 = (code *)0x0;
        local_88._M_unused._M_object = (void *)0x0;
        local_88._8_8_ = 0;
        local_88._M_unused._M_object = operator_new(0x18);
        *(basisu_frontend **)&((basisu_frontend *)local_88._M_unused._0_8_)->m_params = this;
        *(uint *)&(((basisu_frontend *)local_88._M_unused._0_8_)->m_params).m_pSource_blocks =
             uVar16;
        *(uint *)((long)&(((basisu_frontend *)local_88._M_unused._0_8_)->m_params).m_pSource_blocks
                 + 4) = uVar19;
        (((basisu_frontend *)local_88._M_unused._0_8_)->m_params).m_max_endpoint_clusters = local_54
        ;
        pcStack_70 = std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:429:35)>
                     ::_M_invoke;
        local_78 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:429:35)>
                   ::_M_manager;
        job_pool::add_job(this_01,(function<void_()> *)&local_88);
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,__destroy_functor);
        }
        uVar19 = local_48->m_total_blocks;
        this = local_48;
        uVar16 = uVar12;
      } while (uVar12 < uVar19);
    }
    job_pool::wait_for_all((this->m_params).m_pJob_pool);
    uVar13 = (ulong)(this->m_endpoint_clusters).m_size;
    if (uVar13 != 0) {
      pvVar22 = (vector<unsigned_int> *)local_68->m_p;
      lVar24 = 0;
      do {
        pvVar5 = *(void **)((long)&pvVar22->m_p + lVar24);
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
        }
        lVar24 = lVar24 + 0x10;
      } while (uVar13 << 4 != lVar24);
      (this->m_endpoint_clusters).m_size = 0;
    }
    uVar19 = (pbVar25->m_local_endpoints).m_size;
    uVar16 = (this->m_endpoint_clusters).m_size;
    uVar12 = uVar16 - uVar19;
    if (uVar12 != 0) {
      if (uVar16 < uVar19 || uVar12 == 0) {
        if ((this->m_endpoint_clusters).m_capacity < uVar19) {
          elemental_vector::increase_capacity
                    (local_68,uVar19,uVar16 + 1 == uVar19,0x10,(object_mover)0x0,false);
        }
        uVar16 = (this->m_endpoint_clusters).m_size;
        if (uVar19 != uVar16) {
          memset((vector<unsigned_int> *)local_68->m_p + uVar16,0,(ulong)(uVar19 - uVar16) << 4);
        }
      }
      else {
        pvVar5 = local_68->m_p;
        lVar24 = 0;
        do {
          __ptr = *(void **)((long)pvVar5 + lVar24 + (ulong)uVar19 * 0x10);
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          lVar24 = lVar24 + 0x10;
        } while ((ulong)uVar12 << 4 != lVar24);
      }
      (this->m_endpoint_clusters).m_size = uVar19;
    }
    uVar21 = this->m_total_blocks;
    if (uVar21 != 0) {
      lVar24 = 0;
      uVar19 = 0;
      do {
        if ((this->m_block_endpoint_clusters_indices).m_size <= uVar19) goto LAB_002304bb;
        uVar16 = ((this->m_block_endpoint_clusters_indices).m_p)->m_comps[lVar24];
        if ((this->m_endpoint_clusters).m_size <= uVar16) goto LAB_00230485;
        pvVar22 = (vector<unsigned_int> *)local_68->m_p;
        local_88._0_4_ = (int)lVar24;
        puVar7 = pvVar22[uVar16].m_p;
        uVar12 = pvVar22[uVar16].m_size;
        if (&local_88 < puVar7 + uVar12 && (puVar7 <= &local_88 && puVar7 != (uint *)0x0))
        goto LAB_0023049c;
        pvVar22 = pvVar22 + uVar16;
        if (pvVar22->m_capacity <= uVar12) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar22,uVar12 + 1,true,4,(object_mover)0x0,false);
        }
        pvVar22->m_p[pvVar22->m_size] = local_88._0_4_;
        pvVar22->m_size = pvVar22->m_size + 1;
        if ((this->m_endpoint_clusters).m_size <= uVar16) goto LAB_00230485;
        pvVar22 = (vector<unsigned_int> *)local_68->m_p;
        local_88._0_4_ = (int)lVar24 + 1;
        puVar7 = pvVar22[uVar16].m_p;
        uVar12 = pvVar22[uVar16].m_size;
        if (&local_88 < puVar7 + uVar12 && (puVar7 <= &local_88 && puVar7 != (uint *)0x0))
        goto LAB_0023049c;
        pvVar22 = pvVar22 + uVar16;
        if (pvVar22->m_capacity <= uVar12) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar22,uVar12 + 1,true,4,(object_mover)0x0,false);
        }
        pvVar22->m_p[pvVar22->m_size] = local_88._0_4_;
        pvVar22->m_size = pvVar22->m_size + 1;
        uVar19 = uVar19 + 1;
        uVar21 = this->m_total_blocks;
        lVar24 = lVar24 + 2;
      } while (uVar19 < uVar21);
    }
    uVar19 = (this->m_block_selector_cluster_index).m_size;
    if (uVar19 != uVar21) {
      if (uVar19 <= uVar21) {
        if ((this->m_block_selector_cluster_index).m_capacity < uVar21) {
          elemental_vector::increase_capacity
                    (local_40,uVar21,uVar19 + 1 == uVar21,4,(object_mover)0x0,false);
        }
        uVar19 = (this->m_block_selector_cluster_index).m_size;
        memset((this->m_block_selector_cluster_index).m_p + uVar19,0,(ulong)(uVar21 - uVar19) << 2);
      }
      (this->m_block_selector_cluster_index).m_size = uVar21;
    }
    uVar19 = this->m_total_blocks;
    if (uVar19 != 0) {
      uVar16 = 0;
      do {
        uVar12 = uVar16 + 0x80;
        if (uVar12 <= uVar19) {
          uVar19 = uVar12;
        }
        local_88._12_4_ = uVar19;
        local_88._8_4_ = uVar16;
        pcStack_70 = std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:505:35)>
                     ::_M_invoke;
        local_78 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:505:35)>
                   ::_M_manager;
        local_88._M_unused._0_8_ = (undefined8)this;
        job_pool::add_job((this->m_params).m_pJob_pool,(function<void_()> *)&local_88);
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,__destroy_functor);
        }
        uVar19 = this->m_total_blocks;
        uVar16 = uVar12;
      } while (uVar12 < uVar19);
    }
    job_pool::wait_for_all((this->m_params).m_pJob_pool);
    uVar19 = this->m_total_blocks;
    uVar16 = (this->m_encoded_blocks).m_size;
    if (uVar16 != uVar19) {
      if ((uVar16 <= uVar19) && ((this->m_encoded_blocks).m_capacity < uVar19)) {
        elemental_vector::increase_capacity
                  (local_38,uVar19,uVar16 + 1 == uVar19,8,(object_mover)0x0,false);
      }
      (this->m_encoded_blocks).m_size = uVar19;
    }
    if (this->m_total_blocks != 0) {
      uVar19 = 0;
      do {
        if ((this->m_block_endpoint_clusters_indices).m_size <= uVar19) goto LAB_002304bb;
        if ((this->m_block_selector_cluster_index).m_size <= uVar19) goto LAB_002304d5;
        if ((this->m_encoded_blocks).m_size <= uVar19) goto LAB_00230411;
        uVar16 = (this->m_block_endpoint_clusters_indices).m_p[uVar19].m_comps[0];
        if ((this->m_endpoint_cluster_etc_params).m_size <= uVar16) goto LAB_0023046e;
        peVar23 = (this->m_encoded_blocks).m_p + uVar19;
        uVar12 = (this->m_block_selector_cluster_index).m_p[uVar19];
        etc_block::set_block_color5_etc1s
                  (peVar23,(this->m_endpoint_cluster_etc_params).m_p[uVar16].m_color_unscaled);
        if ((this->m_endpoint_cluster_etc_params).m_size <= uVar16) goto LAB_0023046e;
        uVar16 = local_60->m_p[uVar16].m_inten_table[0];
        if (7 < uVar16) {
          __assert_fail("t < 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.h"
                        ,0xc1,"void basisu::etc_block::set_inten_table(uint32_t, uint32_t)");
        }
        cVar15 = (char)uVar16;
        (peVar23->field_0).m_bytes[3] =
             (cVar15 << 2 | cVar15 << 5 | (peVar23->field_0).m_bytes[3] & 2) + 1;
        if ((this->m_optimized_cluster_selectors).m_size <= uVar12) goto LAB_00230411;
        *(undefined4 *)((long)&peVar23->field_0 + 4) =
             *(undefined4 *)((long)&(this->m_optimized_cluster_selectors).m_p[uVar12].field_0 + 4);
        uVar19 = uVar19 + 1;
      } while (uVar19 < this->m_total_blocks);
    }
    pbVar25 = local_50;
    uVar21 = local_54 + 1;
  } while (local_54 + 1 != 3);
  this_00 = &this->m_selector_cluster_block_indices;
  uVar19 = (local_50->m_local_selectors).m_size;
  uVar16 = (this->m_selector_cluster_block_indices).m_size;
  uVar12 = uVar16 - uVar19;
  if (uVar12 != 0) {
    if (uVar16 < uVar19 || uVar12 == 0) {
      if ((this->m_selector_cluster_block_indices).m_capacity < uVar19) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar19,uVar16 + 1 == uVar19,0x10,(object_mover)0x0,
                   false);
      }
      uVar16 = (this->m_selector_cluster_block_indices).m_size;
      if (uVar19 != uVar16) {
        memset(this_00->m_p + uVar16,0,(ulong)(uVar19 - uVar16) << 4);
      }
    }
    else {
      pvVar22 = this_00->m_p;
      lVar24 = 0;
      do {
        pvVar5 = *(void **)((long)&pvVar22[uVar19].m_p + lVar24);
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
        }
        lVar24 = lVar24 + 0x10;
      } while ((ulong)uVar12 << 4 != lVar24);
    }
    (local_48->m_selector_cluster_block_indices).m_size = uVar19;
    this = local_48;
  }
  local_88._M_unused._M_member_pointer = local_88._M_unused._M_member_pointer & 0xffffffff00000000;
  if ((this->m_etc1_blocks_etc1s).m_size != 0) {
    uVar19 = 0;
    do {
      if ((this->m_block_selector_cluster_index).m_size <= uVar19) goto LAB_002304d5;
      uVar19 = (this->m_block_selector_cluster_index).m_p[uVar19];
      if ((this->m_selector_cluster_block_indices).m_size <= uVar19) goto LAB_00230485;
      pvVar22 = this_00->m_p;
      puVar7 = pvVar22[uVar19].m_p;
      uVar16 = pvVar22[uVar19].m_size;
      if (&local_88 < puVar7 + uVar16 && (puVar7 <= &local_88 && puVar7 != (uint *)0x0)) {
LAB_0023049c:
        __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x267,
                      "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]");
      }
      pvVar22 = pvVar22 + uVar19;
      if (pvVar22->m_capacity <= uVar16) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar22,uVar16 + 1,true,4,(object_mover)0x0,false);
      }
      pvVar22->m_p[pvVar22->m_size] = local_88._0_4_;
      pvVar22->m_size = pvVar22->m_size + 1;
      uVar19 = local_88._0_4_ + 1;
      local_88._0_4_ = uVar19;
    } while (uVar19 < (this->m_etc1_blocks_etc1s).m_size);
  }
  return true;
LAB_002304bb:
  pcVar14 = "T &basisu::vector<basisu::vec2U>::operator[](size_t) [T = basisu::vec2U]";
  goto LAB_00230426;
LAB_0023046e:
  pcVar14 = 
  "T &basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[](size_t) [T = basisu::basisu_frontend::endpoint_cluster_etc_params]"
  ;
  goto LAB_00230426;
LAB_00230411:
  pcVar14 = "T &basisu::vector<basisu::etc_block>::operator[](size_t) [T = basisu::etc_block]";
  goto LAB_00230426;
LAB_002304d5:
  pcVar14 = "T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]";
  goto LAB_00230426;
LAB_00230485:
  pcVar14 = 
  "T &basisu::vector<basisu::vector<unsigned int>>::operator[](size_t) [T = basisu::vector<unsigned int>]"
  ;
LAB_00230426:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,pcVar14);
}

Assistant:

bool basisu_frontend::init_global_codebooks()
	{
		const basist::basisu_lowlevel_etc1s_transcoder* pTranscoder = m_params.m_pGlobal_codebooks;

		const basist::basisu_lowlevel_etc1s_transcoder::endpoint_vec& endpoints = pTranscoder->get_endpoints();
		const basist::basisu_lowlevel_etc1s_transcoder::selector_vec& selectors = pTranscoder->get_selectors();
				
		m_endpoint_cluster_etc_params.resize(endpoints.size());
		for (uint32_t i = 0; i < endpoints.size(); i++)
		{
			m_endpoint_cluster_etc_params[i].m_inten_table[0] = endpoints[i].m_inten5;
			m_endpoint_cluster_etc_params[i].m_inten_table[1] = endpoints[i].m_inten5;

			m_endpoint_cluster_etc_params[i].m_color_unscaled[0].set(endpoints[i].m_color5.r, endpoints[i].m_color5.g, endpoints[i].m_color5.b, 255);
			m_endpoint_cluster_etc_params[i].m_color_used[0] = true;
			m_endpoint_cluster_etc_params[i].m_valid = true;
		}

		m_optimized_cluster_selectors.resize(selectors.size());
		for (uint32_t i = 0; i < m_optimized_cluster_selectors.size(); i++)
		{
			for (uint32_t y = 0; y < 4; y++)
				for (uint32_t x = 0; x < 4; x++)
					m_optimized_cluster_selectors[i].set_selector(x, y, selectors[i].get_selector(x, y));
		}

		m_block_endpoint_clusters_indices.resize(m_total_blocks);

		m_orig_encoded_blocks.resize(m_total_blocks);

		m_block_selector_cluster_index.resize(m_total_blocks);

#if 0
		for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
		{
			const uint32_t first_index = block_index_iter;
			const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->add_job([this, first_index, last_index] {
#endif

				for (uint32_t block_index = first_index; block_index < last_index; block_index++)
				{
					const etc_block& blk = m_etc1_blocks_etc1s[block_index];

					const uint32_t block_endpoint_index = m_block_endpoint_clusters_indices[block_index][0];

					etc_block trial_blk;
					trial_blk.set_block_color5_etc1s(blk.m_color_unscaled[0]);
					trial_blk.set_flip_bit(true);

					uint64_t best_err = UINT64_MAX;
					uint32_t best_index = 0;

					for (uint32_t i = 0; i < m_optimized_cluster_selectors.size(); i++)
					{
						trial_blk.set_raw_selector_bits(m_optimized_cluster_selectors[i].get_raw_selector_bits());

						const uint64_t cur_err = trial_blk.evaluate_etc1_error(get_source_pixel_block(block_index).get_ptr(), m_params.m_perceptual);
						if (cur_err < best_err)
						{
							best_err = cur_err;
							best_index = i;
							if (!cur_err)
								break;
						}

					} // block_index

					m_block_selector_cluster_index[block_index] = best_index;
				}

#ifndef __EMSCRIPTEN__
				});
#endif

		}

#ifndef __EMSCRIPTEN__
		m_params.m_pJob_pool->wait_for_all();
#endif

		m_encoded_blocks.resize(m_total_blocks);
		for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
		{
			const uint32_t endpoint_index = m_block_endpoint_clusters_indices[block_index][0];
			const uint32_t selector_index = m_block_selector_cluster_index[block_index];

			etc_block& blk = m_encoded_blocks[block_index];

			blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_color_unscaled[0]);
			blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_inten_table[0]);
			blk.set_flip_bit(true);
			blk.set_raw_selector_bits(m_optimized_cluster_selectors[selector_index].get_raw_selector_bits());
		}
#endif

		// HACK HACK
		const uint32_t NUM_PASSES = 3;
		for (uint32_t pass = 0; pass < NUM_PASSES; pass++)
		{
			debug_printf("init_global_codebooks: pass %u\n", pass);

			const uint32_t N = 128;
			for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
			{
				const uint32_t first_index = block_index_iter;
				const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
				m_params.m_pJob_pool->add_job([this, first_index, last_index, pass] {
#endif
										
					for (uint32_t block_index = first_index; block_index < last_index; block_index++)
					{
						const etc_block& blk = pass ? m_encoded_blocks[block_index] : m_etc1_blocks_etc1s[block_index];
						const uint32_t blk_raw_selector_bits = blk.get_raw_selector_bits();

						etc_block trial_blk(blk);
						trial_blk.set_raw_selector_bits(blk_raw_selector_bits);
						trial_blk.set_flip_bit(true);

						uint64_t best_err = UINT64_MAX;
						uint32_t best_index = 0;
						etc_block best_block(trial_blk);
												
						for (uint32_t i = 0; i < m_endpoint_cluster_etc_params.size(); i++)
						{
							if (m_endpoint_cluster_etc_params[i].m_inten_table[0] > blk.get_inten_table(0))
								continue;

							trial_blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[i].m_color_unscaled[0]);
							trial_blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[i].m_inten_table[0]);

							const color_rgba* pSource_pixels = get_source_pixel_block(block_index).get_ptr();
							uint64_t cur_err;
							if (!pass)
								cur_err = trial_blk.determine_selectors(pSource_pixels, m_params.m_perceptual);
							else
								cur_err = trial_blk.evaluate_etc1_error(pSource_pixels, m_params.m_perceptual);

							if (cur_err < best_err)
							{
								best_err = cur_err;
								best_index = i;
								best_block = trial_blk;

								if (!cur_err)
									break;
							}
						}

						m_block_endpoint_clusters_indices[block_index][0] = best_index;
						m_block_endpoint_clusters_indices[block_index][1] = best_index;

						m_orig_encoded_blocks[block_index] = best_block;

					} // block_index

#ifndef __EMSCRIPTEN__
					});
#endif

			}

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->wait_for_all();
#endif

			m_endpoint_clusters.resize(0);
			m_endpoint_clusters.resize(endpoints.size());
			for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
			{
				const uint32_t endpoint_cluster_index = m_block_endpoint_clusters_indices[block_index][0];
				m_endpoint_clusters[endpoint_cluster_index].push_back(block_index * 2);
				m_endpoint_clusters[endpoint_cluster_index].push_back(block_index * 2 + 1);
			}

			m_block_selector_cluster_index.resize(m_total_blocks);

			for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
			{
				const uint32_t first_index = block_index_iter;
				const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
				m_params.m_pJob_pool->add_job([this, first_index, last_index] {
#endif

					for (uint32_t block_index = first_index; block_index < last_index; block_index++)
					{
						const uint32_t block_endpoint_index = m_block_endpoint_clusters_indices[block_index][0];

						etc_block trial_blk;
						trial_blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[block_endpoint_index].m_color_unscaled[0]);
						trial_blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[block_endpoint_index].m_inten_table[0]);
						trial_blk.set_flip_bit(true);

						uint64_t best_err = UINT64_MAX;
						uint32_t best_index = 0;

						for (uint32_t i = 0; i < m_optimized_cluster_selectors.size(); i++)
						{
							trial_blk.set_raw_selector_bits(m_optimized_cluster_selectors[i].get_raw_selector_bits());

							const uint64_t cur_err = trial_blk.evaluate_etc1_error(get_source_pixel_block(block_index).get_ptr(), m_params.m_perceptual);
							if (cur_err < best_err)
							{
								best_err = cur_err;
								best_index = i;
								if (!cur_err)
									break;
							}

						} // block_index

						m_block_selector_cluster_index[block_index] = best_index;
					}

#ifndef __EMSCRIPTEN__
					});
#endif

			}

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->wait_for_all();
#endif

			m_encoded_blocks.resize(m_total_blocks);
			for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
			{
				const uint32_t endpoint_index = m_block_endpoint_clusters_indices[block_index][0];
				const uint32_t selector_index = m_block_selector_cluster_index[block_index];

				etc_block& blk = m_encoded_blocks[block_index];

				blk.set_block_color5_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_color_unscaled[0]);
				blk.set_inten_tables_etc1s(m_endpoint_cluster_etc_params[endpoint_index].m_inten_table[0]);
				blk.set_flip_bit(true);
				blk.set_raw_selector_bits(m_optimized_cluster_selectors[selector_index].get_raw_selector_bits());
			}

		} // pass

		m_selector_cluster_block_indices.resize(selectors.size());
		for (uint32_t block_index = 0; block_index < m_etc1_blocks_etc1s.size(); block_index++)
			m_selector_cluster_block_indices[m_block_selector_cluster_index[block_index]].push_back(block_index);
				
		return true;
	}